

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonrpc_test.cpp
# Opt level: O2

void __thiscall json_service::check_method(json_service *this,method_type *m,string *s)

{
  vector<cppcms::json::value,_std::allocator<cppcms::json::value>_> *__args;
  value v;
  istringstream ss;
  
  std::__cxx11::istringstream::istringstream((istringstream *)&ss,(string *)s,_S_in);
  cppcms::json::value::copyable::copyable(&v.d);
  cppcms::json::operator>>((istream *)&ss,&v);
  __args = (vector<cppcms::json::value,_std::allocator<cppcms::json::value>_> *)
           cppcms::json::value::array();
  std::
  function<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&)>::
  operator()(m,__args);
  cppcms::json::value::copyable::~copyable(&v.d);
  std::__cxx11::istringstream::~istringstream((istringstream *)&ss);
  return;
}

Assistant:

void check_method(method_type const &m,std::string s)
	{
		std::istringstream ss(s);
		cppcms::json::value v;
		ss >> v;
		m(v.array());
	}